

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall QStyleSheetStyle::QStyleSheetStyle(QStyleSheetStyle *this,QStyle *base)

{
  int iVar1;
  QWindowsStylePrivate *dd;
  QStyleSheetStyleCaches *this_00;
  bool bVar2;
  
  dd = (QWindowsStylePrivate *)operator_new(0x158);
  QStyleSheetStylePrivate::QStyleSheetStylePrivate((QStyleSheetStylePrivate *)dd);
  QWindowsStyle::QWindowsStyle((QWindowsStyle *)this,dd);
  *(undefined ***)this = &PTR_metaObject_007c3e68;
  *(QStyle **)(this + 0x10) = base;
  *(undefined4 *)(this + 0x18) = 1;
  QCss::Parser::Parser((Parser *)(this + 0x20));
  iVar1 = numinstances + 1;
  bVar2 = numinstances == 0;
  numinstances = iVar1;
  if (bVar2) {
    this_00 = (QStyleSheetStyleCaches *)operator_new(0x48);
    QStyleSheetStyleCaches::QStyleSheetStyleCaches((QStyleSheetStyleCaches *)this_00);
    styleSheetCaches = this_00;
  }
  return;
}

Assistant:

QStyleSheetStyle::QStyleSheetStyle(QStyle *base)
    : QWindowsStyle(*new QStyleSheetStylePrivate), base(base), refcount(1)
{
    ++numinstances;
    if (numinstances == 1) {
        styleSheetCaches = new QStyleSheetStyleCaches;
    }
}